

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String __thiscall doctest::detail::rawMemoryToString(detail *this,void *object,uint size)

{
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  char *local_1c0 [4];
  ostringstream os;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar1 = std::operator<<((ostream *)&os,"0x");
  poVar1 = std::operator<<(poVar1,0x30);
  *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  lVar2 = (long)(int)size;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    *(undefined8 *)
     (&os.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10 +
     (long)os.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)&os);
  }
  std::__cxx11::stringbuf::str();
  String::String((String *)this,local_1c0[0]);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  return (String)(char *)this;
}

Assistant:

String rawMemoryToString(const void* object, unsigned size) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>(size), inc = 1;
        if(Endianness::which() == Endianness::Little) {
            i   = end - 1;
            end = inc = -1;
        }

        unsigned char const* bytes = static_cast<unsigned char const*>(object);
        std::ostringstream   os;
        os << "0x" << std::setfill('0') << std::hex;
        for(; i != end; i += inc)
            os << std::setw(2) << static_cast<unsigned>(bytes[i]);
        return os.str().c_str();
    }